

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

Node * __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::DisjunctionPass1
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this)

{
  AltNode **ppAVar1;
  code *pcVar2;
  EncodedChar EVar3;
  bool bVar4;
  AltNode *pAVar5;
  undefined4 *puVar6;
  AltNode *tail;
  AltNode *this_00;
  AltNode *pAVar7;
  AltNode *pAVar8;
  
  pAVar5 = (AltNode *)AlternativePass1(this);
  pAVar8 = pAVar5;
  if ((pAVar5->super_Node).tag == Alt) {
    do {
      this_00 = pAVar8;
      pAVar8 = this_00->tail;
    } while (this_00->tail != (AltNode *)0x0);
  }
  else {
    this_00 = (AltNode *)0x0;
  }
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    while( true ) {
      while( true ) {
        pAVar7 = this_00;
        pAVar8 = pAVar5;
        EVar3 = ECLookahead(this,0);
        if (EVar3 != '|') {
          return &pAVar8->super_Node;
        }
        ECConsume(this,1);
        tail = (AltNode *)AlternativePass1(this);
        if (tail == (AltNode *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x2ea,"(next != nullptr)","next != nullptr");
          if (!bVar4) goto LAB_00d2bbfd;
          *puVar6 = 0;
        }
        pAVar5 = pAVar8;
        if (pAVar7 != (AltNode *)0x0) {
          pAVar5 = (AltNode *)pAVar7->head;
        }
        pAVar5 = (AltNode *)UnionNodes(this,&pAVar5->super_Node,(Node *)tail);
        if (pAVar5 == (AltNode *)0x0) break;
        this_00 = (AltNode *)0x0;
        if (pAVar7 != (AltNode *)0x0) {
          pAVar7->head = (Node *)pAVar5;
          pAVar5 = pAVar8;
          this_00 = pAVar7;
        }
      }
      if ((tail->super_Node).tag == Alt) break;
      this_00 = (AltNode *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x35916e);
      AltNode::AltNode(this_00,(Node *)tail,(AltNode *)0x0);
      if (pAVar7 == (AltNode *)0x0) {
        pAVar5 = (AltNode *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x35916e);
        AltNode::AltNode(pAVar5,&pAVar8->super_Node,this_00);
      }
      else {
        pAVar7->tail = this_00;
        pAVar5 = pAVar8;
      }
    }
    pAVar5 = pAVar8;
    if (pAVar7 != (AltNode *)0x0) {
      pAVar5 = (AltNode *)pAVar7->head;
    }
    pAVar5 = (AltNode *)UnionNodes(this,&pAVar5->super_Node,tail->head);
    if (pAVar5 != (AltNode *)0x0) {
      if (pAVar7 != (AltNode *)0x0) {
        pAVar7->head = (Node *)pAVar5;
        pAVar5 = pAVar8;
      }
      tail = tail->tail;
      pAVar8 = pAVar5;
    }
    if (pAVar7 == (AltNode *)0x0) {
      pAVar5 = (AltNode *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x35916e);
      AltNode::AltNode(pAVar5,&pAVar8->super_Node,tail);
    }
    else {
      pAVar7->tail = tail;
      pAVar5 = pAVar8;
    }
    if (tail == (AltNode *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x309,"(nextList != nullptr)","nextList != nullptr");
      if (!bVar4) {
LAB_00d2bbfd:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    do {
      ppAVar1 = &tail->tail;
      this_00 = tail;
      tail = *ppAVar1;
    } while (*ppAVar1 != (AltNode *)0x0);
  } while( true );
}

Assistant:

Node* Parser<P, IsLiteral>::DisjunctionPass1()
    {
        // Maintain the invariants:
        //  - alt lists have two or more items
        //  - alt list items are never alt lists (so we must inline them)
        //  - an alt list never contains two consecutive match-character/match-set nodes
        //    (so we must union consecutive items into a single set)
        Node* node = AlternativePass1();
        AltNode* last = 0;
        // First node may be an alternative
        if (node->tag == Node::Alt)
        {
            last = (AltNode*)node;
            while (last->tail != 0)
                last = last->tail;
        }
        while (true)
        {
            // Could be terminating 0
            if (ECLookahead() != '|')
                return node;
            ECConsume(); // '|'
            Node* next = AlternativePass1();
            AnalysisAssert(next != nullptr);
            Node* revisedPrev = UnionNodes(last == 0 ? node : last->head, next);
            if (revisedPrev != 0)
            {
                // Can merge next into previously seen alternative
                if (last == 0)
                    node = revisedPrev;
                else
                    last->head = revisedPrev;
            }
            else if (next->tag == Node::Alt)
            {
                AltNode* nextList = (AltNode*)next;
                // Since we just had to dereference next to get here, we know that nextList
                // can't be nullptr in this case.
                AnalysisAssert(nextList != nullptr);
                // Append inner list to current list
                revisedPrev = UnionNodes(last == 0 ? node : last->head, nextList->head);
                if (revisedPrev != 0)
                {
                    // Can merge head of list into previously seen alternative
                    if (last ==0)
                        node = revisedPrev;
                    else
                        last->head = revisedPrev;
                    nextList = nextList->tail;
                }
                if (last == 0)
                    node = Anew(ctAllocator, AltNode, node, nextList);
                else
                    last->tail = nextList;
                AnalysisAssert(nextList != nullptr);
                while (nextList->tail != 0)
                    nextList = nextList->tail;
                last = nextList;
            }
            else
            {
                // Append node
                AltNode* cons = Anew(ctAllocator, AltNode, next, 0);
                if (last == 0)
                    node = Anew(ctAllocator, AltNode, node, cons);
                else
                    last->tail = cons;
                last = cons;
            }
        }
    }